

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void BailOutRecord::SetHasBailedOutBit(BailOutRecord *bailOutRecord,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *this;
  bool *pbVar3;
  undefined4 *puVar4;
  bool *hasBailedOutBitPtr;
  EHBailoutData *ehBailoutData;
  ScriptContext *scriptContext_local;
  BailOutRecord *bailOutRecord_local;
  
  hasBailedOutBitPtr = (bool *)bailOutRecord->ehBailoutData;
  if ((EHBailoutData *)hasBailedOutBitPtr != (EHBailoutData *)0x0) {
    for (; *(int *)(hasBailedOutBitPtr + 0xc) == 2;
        hasBailedOutBitPtr = *(bool **)(hasBailedOutBitPtr + 0x10)) {
      if (*(long *)(hasBailedOutBitPtr + 0x10) == 0) {
        return;
      }
      if (**(int **)(hasBailedOutBitPtr + 0x10) < 0) {
        return;
      }
    }
    this = Js::ScriptContext::GetThreadContext(scriptContext);
    pbVar3 = ThreadContext::GetHasBailedOutBitPtr(this);
    if (pbVar3 == (bool *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x4f1,"(hasBailedOutBitPtr)","hasBailedOutBitPtr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    *pbVar3 = true;
  }
  return;
}

Assistant:

void
BailOutRecord::SetHasBailedOutBit(BailOutRecord const * bailOutRecord, Js::ScriptContext * scriptContext)
{
    Js::EHBailoutData * ehBailoutData = bailOutRecord->ehBailoutData;
    if (!ehBailoutData)
    {
        return;
    }

    // When a bailout occurs within a finally region, the hasBailedOutBitPtr associated with the
    // try-catch-finally or try-finally has already been removed from the stack. In that case,
    // we set the hasBailedOutBitPtr for the nearest enclosing try or catch region within the
    // function.
    while (ehBailoutData->ht == Js::HandlerType::HT_Finally)
    {
        if (!ehBailoutData->parent || ehBailoutData->parent->nestingDepth < 0)
        {
            return;
        }
        ehBailoutData = ehBailoutData->parent;
    }

    bool * hasBailedOutBitPtr = scriptContext->GetThreadContext()->GetHasBailedOutBitPtr();
    Assert(hasBailedOutBitPtr);
    *hasBailedOutBitPtr = true;
}